

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

cstr idx2::ToString<idx2::mmap_err_code>(error<idx2::mmap_err_code> *Err,bool Force)

{
  cstr __s;
  mmap_err_code mVar1;
  long lVar2;
  undefined7 in_register_00000031;
  long *in_FS_OFFSET;
  
  if (((int)CONCAT71(in_register_00000031,Force) == 0) && (Err->StrGened == true)) {
    __s = (cstr)(*in_FS_OFFSET + -0xf80);
  }
  else {
    mVar1 = Err->Code;
    lVar2 = 0x10;
    do {
      if (*(mmap_err_code *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar2) == mVar1)
      goto LAB_001095e8;
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x298);
    mVar1 = __Invalid__;
LAB_001095e8:
    lVar2 = 0x10;
    while (*(mmap_err_code *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar2) != mVar1)
    {
      lVar2 = lVar2 + 0x18;
      if (lVar2 == 0x298) {
        __assert_fail("It != End(EnumS.NameMap)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Applications/../Core/MemoryMap.h"
                      ,0x28,"stref idx2::ToString(mmap_err_code)");
      }
    }
    __s = (cstr)(*in_FS_OFFSET + -0xf80);
    snprintf(__s,0x400,"%.*s (file: %s, line %d): %s",(ulong)*(uint *)(&err_code_s::NameMap + lVar2)
             ,*(undefined8 *)(&err_code_s::NameMap.Len + lVar2),in_FS_OFFSET[-0x110],
             (ulong)*(uint *)(in_FS_OFFSET + -0xd0),Err->Msg);
  }
  return __s;
}

Assistant:

cstr
ToString(const error<t>& Err, bool Force)
{
  if (Force || !Err.StrGened)
  {
    auto ErrStr = ToString(Err.Code);
    snprintf(ScratchBuf,
             sizeof(ScratchBuf),
             "%.*s (file: %s, line %d): %s",
             ErrStr.Size,
             ErrStr.Ptr,
             Err.Files[0],
             Err.Lines[0],
             Err.Msg);
  }
  return ScratchBuf;
}